

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestTU<short,unsigned_char>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<short,unsigned_char>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_char>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_char>::b1 = LessThanTest<short,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_char>()::b1);
    }
  }
  if (ComparisonTestTU<short,unsigned_char>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_char>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_char>::b2 = LessThanEqualTest<short,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_char>()::b2);
    }
  }
  if (ComparisonTestTU<short,unsigned_char>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_char>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_char>::b3 = GreaterThanTest<short,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_char>()::b3);
    }
  }
  if (ComparisonTestTU<short,unsigned_char>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_char>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_char>::b4 = GreaterThanEqualTest<short,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_char>()::b4);
    }
  }
  if (ComparisonTestTU<short,unsigned_char>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_char>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_char>::b5 = EqualTest<short,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_char>()::b5);
    }
  }
  if (ComparisonTestTU<short,unsigned_char>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_char>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_char>::b6 = NotEqualTest<short,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_char>()::b6);
      return;
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}